

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_tet_to_pyr(REF_GRID ref_grid,REF_INT pri,REF_INT tet0,REF_INT tet1)

{
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT new_pyr;
  REF_INT quad_face;
  REF_INT quad_node;
  REF_INT hits;
  REF_INT i;
  REF_INT cell_face;
  REF_INT pyr_nodes [27];
  int local_174;
  REF_INT tet1_nodes [27];
  int local_104;
  REF_INT tet0_nodes [27];
  REF_INT pri_nodes [27];
  REF_INT tet1_local;
  REF_INT tet0_local;
  REF_INT pri_local;
  REF_GRID ref_grid_local;
  
  ref_grid_local._4_4_ = ref_cell_nodes(ref_grid->cell[10],pri,tet0_nodes + 0x1a);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_cell_nodes(ref_grid->cell[8],tet0,tet1_nodes + 0x1a);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = ref_cell_nodes(ref_grid->cell[8],tet1,pyr_nodes + 0x1a);
      if (ref_grid_local._4_4_ == 0) {
        ref_private_macro_code_rss = -1;
        for (hits = 0; hits < ref_grid->cell[10]->face_per; hits = hits + 1) {
          if (ref_grid->cell[10]->f2n[hits << 2] != ref_grid->cell[10]->f2n[hits * 4 + 3]) {
            quad_face = 0;
            for (quad_node = 0; quad_node < 4; quad_node = quad_node + 1) {
              new_pyr = tet0_nodes[(long)ref_grid->cell[10]->f2n[quad_node + hits * 4] + 0x1a];
              if (((((new_pyr == tet1_nodes[0x1a]) || (new_pyr == local_104)) ||
                   (new_pyr == tet0_nodes[0])) ||
                  ((new_pyr == tet0_nodes[1] || (new_pyr == pyr_nodes[0x1a])))) ||
                 ((new_pyr == local_174 ||
                  ((new_pyr == tet1_nodes[0] || (new_pyr == tet1_nodes[1])))))) {
                quad_face = quad_face + 1;
              }
            }
            if ((quad_face != 2) && (quad_face != 4)) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x302,"ref_layer_tet_to_pyr","hits not 2 or 4");
              printf("hits %d\n",(ulong)(uint)quad_face);
              return 1;
            }
            if (quad_face == 4) {
              if ((long)ref_private_macro_code_rss != -1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x304,"ref_layer_tet_to_pyr","two quad faces",0xffffffffffffffff,
                       (long)ref_private_macro_code_rss);
                return 1;
              }
              ref_private_macro_code_rss = hits;
            }
          }
        }
        if (ref_private_macro_code_rss == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x309,"ref_layer_tet_to_pyr","quad face not set");
          ref_grid_local._4_4_ = 1;
        }
        else {
          i = tet0_nodes[(long)ref_grid->cell[10]->f2n[ref_private_macro_code_rss << 2] + 0x1a];
          cell_face = tet0_nodes
                      [(long)ref_grid->cell[10]->f2n[ref_private_macro_code_rss * 4 + 1] + 0x1a];
          pyr_nodes[2] = tet0_nodes
                         [(long)ref_grid->cell[10]->f2n[ref_private_macro_code_rss * 4 + 2] + 0x1a];
          pyr_nodes[1] = tet0_nodes
                         [(long)ref_grid->cell[10]->f2n[ref_private_macro_code_rss * 4 + 3] + 0x1a];
          pyr_nodes[0] = -1;
          for (quad_node = 0; quad_node < 4; quad_node = quad_node + 1) {
            if ((((i != tet1_nodes[(long)quad_node + 0x1a]) &&
                 (cell_face != tet1_nodes[(long)quad_node + 0x1a])) &&
                (pyr_nodes[2] != tet1_nodes[(long)quad_node + 0x1a])) &&
               (pyr_nodes[1] != tet1_nodes[(long)quad_node + 0x1a])) {
              if ((pyr_nodes[0] != -1) && (pyr_nodes[0] != tet1_nodes[(long)quad_node + 0x1a])) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x318,"ref_layer_tet_to_pyr","multiple off nodes");
                return 1;
              }
              pyr_nodes[0] = tet1_nodes[(long)quad_node + 0x1a];
            }
            if (((i != pyr_nodes[(long)quad_node + 0x1a]) &&
                (cell_face != pyr_nodes[(long)quad_node + 0x1a])) &&
               ((pyr_nodes[2] != pyr_nodes[(long)quad_node + 0x1a] &&
                (pyr_nodes[1] != pyr_nodes[(long)quad_node + 0x1a])))) {
              if ((pyr_nodes[0] != -1) && (pyr_nodes[0] != pyr_nodes[(long)quad_node + 0x1a])) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x31e,"ref_layer_tet_to_pyr","multiple off nodes");
                return 1;
              }
              pyr_nodes[0] = pyr_nodes[(long)quad_node + 0x1a];
            }
          }
          if (pyr_nodes[0] == -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x322,"ref_layer_tet_to_pyr","pyramid peak not set");
            ref_grid_local._4_4_ = 1;
          }
          else {
            ref_grid_local._4_4_ = ref_cell_remove(ref_grid->cell[8],tet0);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = ref_cell_remove(ref_grid->cell[8],tet1);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ =
                     ref_cell_add(ref_grid->cell[9],&i,&ref_private_macro_code_rss_1);
                if (ref_grid_local._4_4_ == 0) {
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x327,"ref_layer_tet_to_pyr",(ulong)ref_grid_local._4_4_,"add pyr");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x325,"ref_layer_tet_to_pyr",(ulong)ref_grid_local._4_4_,"rm tet1");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x324,"ref_layer_tet_to_pyr",(ulong)ref_grid_local._4_4_,"rm tet0");
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x2f1,"ref_layer_tet_to_pyr",(ulong)ref_grid_local._4_4_,"tet1 nodes");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2f0
             ,"ref_layer_tet_to_pyr",(ulong)ref_grid_local._4_4_,"tet0 nodes");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2ef,
           "ref_layer_tet_to_pyr",(ulong)ref_grid_local._4_4_,"pri nodes");
  }
  return ref_grid_local._4_4_;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_tet_to_pyr(REF_GRID ref_grid, REF_INT pri,
                                               REF_INT tet0, REF_INT tet1) {
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet0_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet1_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pyr_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell_face, i, hits, quad_node, quad_face, new_pyr;

  RSS(ref_cell_nodes(ref_grid_pri(ref_grid), pri, pri_nodes), "pri nodes");
  RSS(ref_cell_nodes(ref_grid_tet(ref_grid), tet0, tet0_nodes), "tet0 nodes");
  RSS(ref_cell_nodes(ref_grid_tet(ref_grid), tet1, tet1_nodes), "tet1 nodes");

  quad_face = REF_EMPTY;
  each_ref_cell_cell_face(ref_grid_pri(ref_grid), cell_face) {
    if (ref_cell_f2n_gen(ref_grid_pri(ref_grid), 0, cell_face) !=
        ref_cell_f2n_gen(ref_grid_pri(ref_grid), 3, cell_face)) {
      hits = 0;
      for (i = 0; i < 4; i++) {
        quad_node =
            pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), i, cell_face)];
        if (quad_node == tet0_nodes[0] || quad_node == tet0_nodes[1] ||
            quad_node == tet0_nodes[2] || quad_node == tet0_nodes[3] ||
            quad_node == tet1_nodes[0] || quad_node == tet1_nodes[1] ||
            quad_node == tet1_nodes[2] || quad_node == tet1_nodes[3])
          hits++;
      }
      RAB(hits == 2 || hits == 4, "hits not 2 or 4",
          { printf("hits %d\n", hits); });
      if (4 == hits) {
        REIS(REF_EMPTY, quad_face, "two quad faces");
        quad_face = cell_face;
      }
    }
  }
  RUS(REF_EMPTY, quad_face, "quad face not set");
  /* aflr winding, quad points into prism */
  pyr_nodes[0] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 0, quad_face)];
  pyr_nodes[1] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 1, quad_face)];
  pyr_nodes[4] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 2, quad_face)];
  pyr_nodes[3] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 3, quad_face)];
  pyr_nodes[2] = REF_EMPTY;
  for (i = 0; i < 4; i++) {
    if (pyr_nodes[0] != tet0_nodes[i] && pyr_nodes[1] != tet0_nodes[i] &&
        pyr_nodes[4] != tet0_nodes[i] && pyr_nodes[3] != tet0_nodes[i]) {
      RAS(pyr_nodes[2] == REF_EMPTY || pyr_nodes[2] == tet0_nodes[i],
          "multiple off nodes");
      pyr_nodes[2] = tet0_nodes[i];
    }
    if (pyr_nodes[0] != tet1_nodes[i] && pyr_nodes[1] != tet1_nodes[i] &&
        pyr_nodes[4] != tet1_nodes[i] && pyr_nodes[3] != tet1_nodes[i]) {
      RAS(pyr_nodes[2] == REF_EMPTY || pyr_nodes[2] == tet1_nodes[i],
          "multiple off nodes");
      pyr_nodes[2] = tet1_nodes[i];
    }
  }
  RUS(REF_EMPTY, pyr_nodes[2], "pyramid peak not set");

  RSS(ref_cell_remove(ref_grid_tet(ref_grid), tet0), "rm tet0");
  RSS(ref_cell_remove(ref_grid_tet(ref_grid), tet1), "rm tet1");

  RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_pyr), "add pyr");

  return REF_SUCCESS;
}